

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool __thiscall
wallet::WalletBatch::EraseActiveScriptPubKeyMan(WalletBatch *this,uint8_t type,bool internal)

{
  bool bVar1;
  undefined3 in_register_00000011;
  undefined1 *__str;
  long in_FS_OFFSET;
  string key;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
  pStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (CONCAT31(in_register_00000011,internal) == 0) {
    __str = DBKeys::ACTIVEEXTERNALSPK_abi_cxx11_;
  }
  else {
    __str = DBKeys::ACTIVEINTERNALSPK_abi_cxx11_;
  }
  std::__cxx11::string::string
            ((string *)&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
  std::__cxx11::string::string((string *)&pStack_68,&local_40);
  pStack_68.second = type;
  bVar1 = EraseIC<std::pair<std::__cxx11::string,unsigned_char>>(this,&pStack_68);
  std::__cxx11::string::~string((string *)&pStack_68);
  std::__cxx11::string::~string((string *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::EraseActiveScriptPubKeyMan(uint8_t type, bool internal)
{
    const std::string key{internal ? DBKeys::ACTIVEINTERNALSPK : DBKeys::ACTIVEEXTERNALSPK};
    return EraseIC(make_pair(key, type));
}